

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O0

void license::LicenseGenerator::printHelp(char *prog_name,options_description *options)

{
  ostream *poVar1;
  void *pvVar2;
  options_description *options_local;
  char *prog_name_local;
  
  std::ostream::operator<<(std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)std::cout,prog_name);
  poVar1 = std::operator<<(poVar1," Version ");
  poVar1 = std::operator<<(poVar1,"1.1.0");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,". Usage:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)std::cout,prog_name);
  poVar1 = std::operator<<(poVar1," [options] product_name1 product_name2 ... ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)std::cout,
                           " product_name1 ... = Product name. This string must match the one passed by the software."
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pvVar2 = (void *)boost::program_options::operator<<((ostream *)std::cout,options);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LicenseGenerator::printHelp(const char* prog_name,
		const po::options_description& options) {
	cout << endl;
	cout << prog_name << " Version " << PROJECT_VERSION << endl << ". Usage:"
			<< endl;
	cout << prog_name << " [options] product_name1 product_name2 ... " << endl
			<< endl;
	cout
			<< " product_name1 ... = Product name. This string must match the one passed by the software."
			<< endl;
	cout << options << endl;
}